

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::block(Forth *this)

{
  undefined8 __n;
  uint uVar1;
  bool bVar2;
  byte bVar3;
  _Ios_Openmode _Var4;
  uint dst;
  reference ppVar5;
  basic_fstream<char,_std::char_traits<char>_> *__p;
  element_type *peVar6;
  size_type sVar7;
  char *src;
  mapped_type *pmVar8;
  undefined8 local_488;
  BlockInfo newBlock;
  uint address;
  uint ec;
  string fileContent;
  streamsize readBytes;
  char buffer [1024];
  undefined1 local_38 [8];
  shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_> f;
  _Self local_20;
  iterator foundIt;
  Cell u;
  Forth *this_local;
  
  requireDStackDepth(this,1,"BLOCK");
  requireDStackAvailable(this,1,"BLOCK");
  foundIt._M_node._4_4_ = ForthStack<unsigned_int>::getTop(&this->dStack);
  if (foundIt._M_node._4_4_ != 0) {
    local_20._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_cppforth::Forth::BlockInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_cppforth::Forth::BlockInfo>_>_>
         ::find(&this->blocksInProcess,(key_type *)((long)&foundIt._M_node + 4));
    f.
    super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         std::
         map<unsigned_int,_cppforth::Forth::BlockInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_cppforth::Forth::BlockInfo>_>_>
         ::end(&this->blocksInProcess);
    bVar2 = std::operator==(&local_20,
                            (_Self *)&f.
                                      super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      __p = (basic_fstream<char,_std::char_traits<char>_> *)operator_new(0x210);
      _Var4 = std::operator|(_S_in,_S_bin);
      std::fstream::fstream(__p,(string *)&this->blockFileName,_Var4);
      std::shared_ptr<std::fstream>::shared_ptr<std::fstream,void>
                ((shared_ptr<std::fstream> *)local_38,__p);
      std::
      __shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)local_38);
      bVar3 = std::fstream::is_open();
      if ((bVar3 & 1) != 0) {
        peVar6 = std::
                 __shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_38);
        std::istream::seekg((long)peVar6,(foundIt._M_node._4_4_ - 1) * 0x400);
        peVar6 = std::
                 __shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_38);
        std::istream::read((char *)peVar6,(long)&readBytes);
        std::
        __shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)local_38);
        fileContent.field_2._8_8_ = std::istream::gcount();
        std::
        __shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)local_38);
        std::fstream::close();
        __n = fileContent.field_2._8_8_;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&ec,(char *)&readBytes,__n,(allocator<char> *)((long)&address + 3));
        std::allocator<char>::~allocator((allocator<char> *)((long)&address + 3));
        sVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                size((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ec);
        ForthStack<unsigned_int>::setTop(&this->dStack,(uint)sVar7);
        memAllocate(this);
        ForthStack<unsigned_int>::getTop(&this->dStack);
        pop(this);
        dst = ForthStack<unsigned_int>::getTop(&this->dStack);
        src = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ec);
        sVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                size((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ec);
        moveIntoDataSpace(this,dst,src,sVar7);
        uVar1 = foundIt._M_node._4_4_;
        pmVar8 = std::
                 map<unsigned_int,_cppforth::Forth::BlockInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_cppforth::Forth::BlockInfo>_>_>
                 ::operator[](&this->blocksInProcess,(key_type *)((long)&foundIt._M_node + 4));
        pmVar8->blockNumber = uVar1;
        pmVar8->blockLocation = dst;
        *(undefined4 *)&pmVar8->blockModified = 0;
        std::__cxx11::string::~string((string *)&ec);
      }
      std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>::~shared_ptr
                ((shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_> *)local_38);
    }
    else {
      ppVar5 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_cppforth::Forth::BlockInfo>_>::
               operator*(&local_20);
      ForthStack<unsigned_int>::setTop(&this->dStack,(ppVar5->second).blockLocation);
    }
    this->blockCurrent = foundIt._M_node._4_4_;
  }
  return;
}

Assistant:

void block(){
			REQUIRE_DSTACK_DEPTH(1, "BLOCK");
			REQUIRE_DSTACK_AVAILABLE(1, "BLOCK");
			Cell u=dStack.getTop();
			if(u>0){
				auto foundIt=blocksInProcess.find(u);
				if(foundIt!=blocksInProcess.end()){
					dStack.setTop((*foundIt).second.blockLocation);	
				} else {	
				std::shared_ptr<std::fstream> f{ new std::fstream(blockFileName, std::ios_base::in | std::ios_base::binary) };
					if (f->is_open()) {
						f->seekg(static_cast<size_t>(u-1)*1024L , std::ios_base::beg);
						char buffer[1024];
						f->read(buffer,1024);   // read from the file
						auto readBytes=f->gcount();
						f->close();
						std::string fileContent{buffer,static_cast<size_t>(readBytes)};
						// get memory
						dStack.setTop(fileContent.size());
						memAllocate();	
						auto ec=dStack.getTop();pop();
						// copy to memory
						auto address=dStack.getTop();
						moveIntoDataSpace(address,fileContent.c_str(),fileContent.size());
						// save block info
						struct BlockInfo newBlock {};
						newBlock.blockNumber = u;
						newBlock.blockLocation = address;
						newBlock.blockModified = false;
						blocksInProcess[u] = newBlock;
						// push address - address already on stack top
					}
				}
				blockCurrent = u;
			}
		}